

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  int fd;
  int *piVar1;
  bool bVar2;
  undefined1 local_14a;
  undefined1 local_149;
  int local_13c;
  string local_138;
  undefined8 local_110;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  undefined1 local_15;
  int gtest_retval;
  char status_ch;
  DeathTestImpl *pDStack_10;
  AbortReason reason_local;
  DeathTestImpl *this_local;
  
  if (reason == TEST_DID_NOT_DIE) {
    local_149 = 0x4c;
  }
  else {
    local_14a = 0x54;
    if (reason != TEST_THREW_EXCEPTION) {
      local_14a = 0x52;
    }
    local_149 = local_14a;
  }
  local_15 = local_149;
  gtest_retval = reason;
  pDStack_10 = this;
  while( true ) {
    do {
      fd = write_fd(this);
      local_1c = posix::Write(fd,&local_15,1);
      bVar2 = false;
      if (local_1c == -1) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (local_1c == -1) break;
    bVar2 = AlwaysFalse();
    if (!bVar2) {
      _Exit(1);
      _Unwind_Resume(local_110);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"CHECK failed: File ",&local_101);
  std::operator+(&local_e0,&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_c0,&local_e0,", line ");
  local_13c = 0x20d;
  StreamableToString<int>(&local_138,&local_13c);
  std::operator+(&local_a0,&local_c0,&local_138);
  std::operator+(&local_80,&local_a0,": ");
  std::operator+(&local_60,&local_80,"posix::Write(write_fd(), &status_ch, 1)");
  std::operator+(&local_40,&local_60," != -1");
  DeathTestAbort(&local_40);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch = reason == TEST_DID_NOT_DIE       ? kDeathTestLived
                         : reason == TEST_THREW_EXCEPTION ? kDeathTestThrew
                                                          : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _Exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _Exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}